

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * cJSON_PrintBuffered(cJSON *item,int prebuffer,cJSON_bool fmt)

{
  cJSON_bool cVar1;
  printbuffer local_58;
  
  local_58.depth = 0;
  if (-1 < prebuffer) {
    local_58.buffer = (uchar *)(*global_hooks.allocate)((ulong)(uint)prebuffer);
    if (local_58.buffer != (uchar *)0x0) {
      local_58.offset = 0;
      local_58.noalloc = 0;
      local_58.hooks.allocate = global_hooks.allocate;
      local_58.hooks.deallocate = global_hooks.deallocate;
      local_58.hooks.reallocate = global_hooks.reallocate;
      local_58.length = (ulong)(uint)prebuffer;
      local_58.format = fmt;
      cVar1 = print_value(item,&local_58);
      if (cVar1 != 0) {
        return (char *)local_58.buffer;
      }
      (*global_hooks.deallocate)(local_58.buffer);
    }
  }
  return (char *)0x0;
}

Assistant:

CJSON_PUBLIC(char *) cJSON_PrintBuffered(const cJSON *item, int prebuffer, cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if (prebuffer < 0)
    {
        return NULL;
    }

    p.buffer = (unsigned char*)global_hooks.allocate((size_t)prebuffer);
    if (!p.buffer)
    {
        return NULL;
    }

    p.length = (size_t)prebuffer;
    p.offset = 0;
    p.noalloc = false;
    p.format = fmt;
    p.hooks = global_hooks;

    if (!print_value(item, &p))
    {
        global_hooks.deallocate(p.buffer);
        p.buffer = NULL;
        return NULL;
    }

    return (char*)p.buffer;
}